

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Annotation.h
# Opt level: O0

void __thiscall
OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
setTrailParameters(AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *this,
                  float duration,int vertexCount)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  Vec3 *pVVar4;
  void *pvVar5;
  undefined4 in_ESI;
  long in_RDI;
  undefined4 in_XMM0_Da;
  int i;
  Vec3 *local_50;
  int local_20;
  
  *(undefined4 *)(in_RDI + 0x40) = in_XMM0_Da;
  *(undefined4 *)(in_RDI + 0x38) = in_ESI;
  *(undefined4 *)(in_RDI + 0x3c) = 0;
  *(undefined4 *)(in_RDI + 0x48) = 0;
  *(float *)(in_RDI + 0x44) = *(float *)(in_RDI + 0x40) / (float)*(int *)(in_RDI + 0x38);
  *(undefined4 *)(in_RDI + 0x4c) = 1;
  if (*(void **)(in_RDI + 0x60) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x60));
  }
  uVar2 = (ulong)*(int *)(in_RDI + 0x38);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0xc),0);
  if (SUB168(auVar1 * ZEXT816(0xc),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pVVar4 = (Vec3 *)operator_new__(uVar3);
  if (uVar2 != 0) {
    local_50 = pVVar4;
    do {
      Vec3::Vec3(local_50);
      local_50 = local_50 + 1;
    } while (local_50 != pVVar4 + uVar2);
  }
  *(Vec3 **)(in_RDI + 0x60) = pVVar4;
  if (*(void **)(in_RDI + 0x68) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x68));
  }
  pvVar5 = operator_new__((long)*(int *)(in_RDI + 0x38));
  *(void **)(in_RDI + 0x68) = pvVar5;
  for (local_20 = 0; local_20 < *(int *)(in_RDI + 0x38); local_20 = local_20 + 1) {
    *(undefined1 *)(*(long *)(in_RDI + 0x68) + (long)local_20) = 0;
  }
  return;
}

Assistant:

void 
OpenSteer::AnnotationMixin<Super>::setTrailParameters (const float duration, 
                                                       const int vertexCount)
{
    // record new parameters
    trailDuration = duration;
    trailVertexCount = vertexCount;

    // reset other internal trail state
    trailIndex = 0;
    trailLastSampleTime = 0;
    trailSampleInterval = trailDuration / trailVertexCount;
    trailDottedPhase = 1;

    // prepare trailVertices array: free old one if needed, allocate new one
    delete[] trailVertices;
    trailVertices = new Vec3[trailVertexCount];

    // prepare trailFlags array: free old one if needed, allocate new one
    delete[] trailFlags;
    trailFlags = new char[trailVertexCount];

    // initializing all flags to zero means "do not draw this segment"
    for (int i = 0; i < trailVertexCount; i++) trailFlags[i] = 0;
}